

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  undefined1 local_30 [32];
  
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    poVar1 = this->stream;
    local_30._0_8_ = this->colourImpl;
    local_30._8_4_ = FileName;
    local_30[0xc] = false;
    ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_30,poVar1);
    std::operator<<(poVar1," for: ");
    ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_30);
    poVar1 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_30,this->result);
    std::operator<<(poVar1,(string *)local_30);
    std::__cxx11::string::~string((string *)local_30);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            stream << colourImpl->guardColour(compactDimColour) << " for: ";
            stream << result.getExpandedExpression();
        }
    }